

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::DescriptorProto::ByteSizeLong(DescriptorProto *this)

{
  uint uVar1;
  Rep *pRVar2;
  size_t sVar3;
  size_t sVar4;
  void **ppvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  lVar8 = (long)(this->field_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->field_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar9 = lVar8 * 8;
  for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      (*(FieldDescriptorProto **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>
                      (*(DescriptorProto **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>
                      (*(EnumDescriptorProto **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ExtensionRange>
                      (*(DescriptorProto_ExtensionRange **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar2 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      (*(FieldDescriptorProto **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::OneofDescriptorProto>
                      (*(OneofDescriptorProto **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar9;
  pRVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto_ReservedRange>
                      (*(DescriptorProto_ReservedRange **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  uVar1 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  sVar3 = lVar8 + (ulong)uVar1;
  uVar10 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    sVar4 = internal::WireFormatLite::StringSize
                      ((string *)
                       ((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[uVar10]);
    sVar3 = sVar3 + sVar4;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar3 = sVar3 + sVar4 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::MessageOptions>
                        (this->options_);
      sVar3 = sVar3 + sVar4 + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar3;
    return sVar3;
  }
  sVar3 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar3,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t DescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  total_size += 1UL * this->_internal_field_size();
  for (const auto& msg : this->field_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  total_size += 1UL * this->_internal_nested_type_size();
  for (const auto& msg : this->nested_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  total_size += 1UL * this->_internal_enum_type_size();
  for (const auto& msg : this->enum_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  total_size += 1UL * this->_internal_extension_range_size();
  for (const auto& msg : this->extension_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  total_size += 1UL * this->_internal_extension_size();
  for (const auto& msg : this->extension_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  total_size += 1UL * this->_internal_oneof_decl_size();
  for (const auto& msg : this->oneof_decl_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  total_size += 1UL * this->_internal_reserved_range_size();
  for (const auto& msg : this->reserved_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string reserved_name = 10;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(reserved_name_.size());
  for (int i = 0, n = reserved_name_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      reserved_name_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}